

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ffint_u_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  float32 fVar7;
  float64 fVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_40 [2];
  
  lVar4 = (ulong)ws * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar10 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = uint32_to_float32_mips64
                        (*(uint32_t *)((long)(env->active_fpu).fpr + lVar10 * 4 + lVar4 + -0x338),
                         pfVar2);
      *(float32 *)((long)local_40 + lVar10 * 4) = fVar7;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((fVar7 & 0x7f800000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((fVar7 & 0x7fffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar5 = ieee_ex_to_mips_mips64(uVar13);
      uVar9 = (env->active_tc).msacsr;
      uVar12 = (uVar9 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar11 = 3;
      if ((uVar9 & 0x1000000) == 0) {
        uVar11 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar11 = uVar12;
      }
      uVar11 = uVar11 | uVar5;
      uVar6 = (uint)((uVar9 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar12 = uVar6 | uVar11;
      uVar13 = uVar5 & 0xfffffffc;
      if ((uVar6 != 0 || (uVar11 & 1) != 0) || (uVar9 & 0x100) != 0) {
        uVar13 = uVar12;
      }
      if ((uVar11 & 2) == 0) {
        uVar13 = uVar12;
      }
      if ((uVar13 & (uVar9 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar13 << 0xc;
LAB_008d55d8:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar9;
      }
      else if ((uVar9 >> 0x12 & 1) == 0) {
        uVar11 = uVar13 << 0xc | uVar9;
        uVar9 = uVar9 & 0xfff80fff;
        goto LAB_008d55d8;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) != 0) {
        fVar7 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)local_40 + lVar10 * 4) = fVar7 & 0xffffffc0 ^ 0x400000 | uVar13;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1cf5,
                    "void helper_msa_ffint_u_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar10 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar8 = uint64_to_float64_mips64
                        (*(uint64_t *)((long)(env->active_fpu).fpr + lVar10 * 8 + lVar4 + -0x338),
                         pfVar2);
      local_40[lVar10] = fVar8;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((fVar8 & 0x7ff0000000000000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((fVar8 & 0x7fffffffffffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar5 = ieee_ex_to_mips_mips64(uVar13);
      uVar9 = (env->active_tc).msacsr;
      uVar12 = (uVar9 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar11 = 3;
      if ((uVar9 & 0x1000000) == 0) {
        uVar11 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar11 = uVar12;
      }
      uVar11 = uVar11 | uVar5;
      uVar6 = (uint)((uVar9 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar12 = uVar6 | uVar11;
      uVar13 = uVar5 & 0xfffffffc;
      if ((uVar6 != 0 || (uVar11 & 1) != 0) || (uVar9 & 0x100) != 0) {
        uVar13 = uVar12;
      }
      if ((uVar11 & 2) == 0) {
        uVar13 = uVar12;
      }
      if ((uVar13 & (uVar9 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar13 << 0xc;
LAB_008d54a4:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar9;
      }
      else if ((uVar9 >> 0x12 & 1) == 0) {
        uVar11 = uVar13 << 0xc | uVar9;
        uVar9 = uVar9 & 0xfff80fff;
        goto LAB_008d54a4;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) != 0) {
        fVar8 = float64_default_nan_mips64(pfVar2);
        local_40[lVar10] = (long)(int)uVar13 | fVar8 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
  }
  uVar13 = (env->active_tc).msacsr;
  uVar9 = uVar13 >> 7 & 0x1f | 0x20;
  if ((uVar9 & uVar13 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar9);
  }
  (env->active_tc).msacsr = (uVar13 >> 0xc & 0x1f) << 2 | uVar13;
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_ffint_u_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                           uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_uint32, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_uint64, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}